

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  TimeInMillis ms;
  TimeInMillis ms_00;
  bool bVar8;
  uint uVar9;
  UnitTestImpl *pUVar10;
  long lVar11;
  string local_b8;
  undefined1 local_98 [8];
  string kTestsuites;
  string kIndent;
  long local_50;
  UnitTest *local_38;
  
  local_98 = (undefined1  [8])&kTestsuites._M_string_length;
  local_38 = unit_test;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testsuites","");
  kTestsuites.field_2._8_8_ = &kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&kTestsuites.field_2 + 8),'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"tests","")
  ;
  iVar4 = UnitTestImpl::reportable_test_count(local_38->impl_);
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),iVar4,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"failures","");
  iVar4 = UnitTestImpl::failed_test_count(local_38->impl_);
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),iVar4,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"disabled","");
  iVar4 = UnitTestImpl::reportable_disabled_test_count(local_38->impl_);
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),iVar4,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"errors","");
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),0,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kIndent.field_2 + 8),"random_seed","");
    OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),
                  local_38->impl_->random_seed_,(string *)((long)&kTestsuites.field_2 + 8),true);
    if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
      operator_delete((void *)kIndent.field_2._8_8_);
    }
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_b8,(internal *)local_38->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),&local_b8,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_b8,(internal *)local_38->impl_->elapsed_time_,ms_00);
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),&local_b8,
                (string *)((long)&kTestsuites.field_2 + 8),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  TestPropertiesAsJson
            ((string *)((long)&kIndent.field_2 + 8),&local_38->impl_->ad_hoc_test_result_,
             (string *)((long)&kTestsuites.field_2 + 8));
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kIndent.field_2._8_8_,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\n",2);
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&kIndent.field_2 + 8),"name","");
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"AllTests","");
  OutputJsonKey(stream,(string *)local_98,(string *)((long)&kIndent.field_2 + 8),&local_b8,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((undefined1 *)kIndent.field_2._8_8_ != &stack0xffffffffffffffb8) {
    operator_delete((void *)kIndent.field_2._8_8_);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_98,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\": [\n",5);
  pUVar10 = local_38->impl_;
  ppTVar6 = (pUVar10->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar10->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6) >> 3)) {
    lVar11 = 0;
    bVar3 = false;
    do {
      ppTVar7 = (ppTVar6[lVar11]->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = *(pointer *)
                 ((long)&(ppTVar6[lVar11]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar7 != ppTVar2) {
        iVar4 = 0;
        do {
          uVar9 = (*ppTVar7)->is_in_another_shard_ ^ 1;
          if ((*ppTVar7)->matches_filter_ == false) {
            uVar9 = 0;
          }
          iVar4 = iVar4 + uVar9;
          ppTVar7 = ppTVar7 + 1;
        } while (ppTVar7 != ppTVar2);
        if (iVar4 != 0) {
          bVar8 = true;
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            bVar8 = bVar3;
          }
          PrintJsonTestSuite(stream,(local_38->impl_->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar11]);
          bVar3 = bVar8;
        }
      }
      lVar11 = lVar11 + 1;
      pUVar10 = local_38->impl_;
      ppTVar6 = (pUVar10->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(pUVar10->test_suites_).
                                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6
                                   ) >> 3));
  }
  bVar3 = TestResult::Failed(&pUVar10->ad_hoc_test_result_);
  if (bVar3) {
    OutputJsonTestSuiteForTestResult(stream,&local_38->impl_->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  if ((size_type *)kTestsuites.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)kTestsuites.field_2._8_8_);
  }
  if (local_98 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_98);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}